

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_wiener_convolve_ssse3.c
# Opt level: O0

void av1_highbd_wiener_convolve_add_src_ssse3
               (uint8_t *src8,ptrdiff_t src_stride,uint8_t *dst8,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params,int bd)

{
  undefined1 (*pauVar1) [16];
  long lVar2;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar38;
  int iVar39;
  undefined8 *puVar40;
  long in_RCX;
  long lVar41;
  long in_RDX;
  char cVar42;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i res_7_1;
  __m128i res_5_1;
  __m128i res_3_1;
  __m128i res_1_1;
  __m128i src_7;
  __m128i src_5;
  __m128i src_3;
  __m128i src_1;
  __m128i res_even_1;
  __m128i res_6_1;
  __m128i res_4_1;
  __m128i res_2_1;
  __m128i res_0_1;
  __m128i src_6;
  __m128i src_4;
  __m128i src_2;
  __m128i src_0;
  uint16_t *data_1;
  __m128i round_const_1;
  __m128i coeff_67_1;
  __m128i coeff_45_1;
  __m128i coeff_23_1;
  __m128i coeff_01_1;
  __m128i tmp_1_1;
  __m128i tmp_0_1;
  __m128i coeffs_y;
  __m128i res;
  __m128i maxval;
  __m128i res_odd;
  __m128i res_7;
  __m128i res_5;
  __m128i res_3;
  __m128i res_1;
  __m128i res_even;
  __m128i res_6;
  __m128i res_4;
  __m128i res_2;
  __m128i res_0;
  __m128i data2;
  __m128i data;
  __m128i round_const;
  __m128i coeff_67;
  __m128i coeff_45;
  __m128i coeff_23;
  __m128i coeff_01;
  __m128i tmp_1;
  __m128i tmp_0;
  __m128i coeffs_x;
  __m128i offset;
  __m128i zero;
  uint16_t *src_ptr;
  int center_tap;
  int j;
  int i;
  int intermediate_height;
  uint16_t temp [17280];
  uint16_t *dst;
  uint16_t *src;
  undefined8 local_9448;
  undefined8 uStack_9440;
  undefined8 local_92a8;
  undefined8 local_9298;
  undefined8 local_9288;
  undefined8 local_9278;
  undefined8 local_9238;
  undefined8 uStack_9230;
  undefined8 local_9148;
  undefined8 local_9138;
  undefined8 local_9128;
  undefined8 local_9118;
  int local_90a4;
  int local_90a0;
  undefined8 local_9098 [32];
  undefined8 auStack_8f98 [32];
  undefined8 auStack_8e98 [32];
  undefined8 auStack_8d98 [32];
  undefined8 auStack_8c98 [32];
  undefined8 auStack_8b98 [32];
  undefined8 auStack_8a98 [32];
  undefined8 auStack_8998 [4108];
  short sStack_932;
  short sStack_912;
  undefined4 uStack_8c4;
  undefined4 uStack_8a4;
  undefined4 uStack_85c;
  undefined4 uStack_83c;
  undefined4 uStack_7a0;
  undefined4 uStack_790;
  undefined4 uStack_780;
  undefined4 uStack_770;
  undefined4 uStack_760;
  undefined4 uStack_750;
  undefined4 uStack_740;
  undefined4 uStack_730;
  undefined8 local_568;
  int iStack_4ec;
  int local_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int local_4a8;
  int iStack_4a4;
  int iStack_4a0;
  int iStack_49c;
  int local_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int local_488;
  int iStack_484;
  int iStack_480;
  int iStack_47c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  int local_448;
  int iStack_444;
  int iStack_440;
  int iStack_43c;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_428;
  int iStack_424;
  int iStack_420;
  int iStack_41c;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int local_3c8;
  int iStack_3c4;
  int iStack_3c0;
  int iStack_3bc;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  int iStack_38c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined2 local_158;
  undefined2 uStack_156;
  undefined2 uStack_154;
  undefined2 uStack_152;
  undefined2 local_148;
  undefined2 uStack_146;
  undefined2 uStack_144;
  undefined2 uStack_142;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  __m128i *p;
  __m128i res_16bit;
  __m128i maxval_1;
  __m128i res_hi_round;
  __m128i res_lo_round;
  __m128i res_hi;
  __m128i res_lo;
  __m128i res_odd_1;
  
  lVar2 = in_RDI * 2 + -6 + in_RSI * -6;
  uVar10 = *in_R8;
  sStack_912 = (short)((ulong)uVar10 >> 0x30);
  uStack_8a4 = (undefined4)(CONCAT26(sStack_912 + 0x80,(int6)uVar10) >> 0x20);
  uVar14 = (undefined4)in_R8[1];
  uStack_83c = (undefined4)((ulong)in_R8[1] >> 0x20);
  uVar13 = CONCAT44((int)uVar10,(int)uVar10);
  local_9118 = CONCAT44(uStack_8a4,uStack_740);
  uVar10 = CONCAT44(uVar14,uVar14);
  local_9138 = CONCAT44(uStack_83c,uStack_760);
  iVar39 = (1 << (*(char *)res_3_1[1] - 1U & 0x1f)) + (1 << ((byte)res_1_1[0] + 6 & 0x1f));
  res_16bit[0]._4_2_ = (undefined2)iVar39;
  res_16bit[0]._6_2_ = (undefined2)((uint)iVar39 >> 0x10);
  for (local_90a0 = 0; local_90a0 < (int)res_3_1[0] + 7; local_90a0 = local_90a0 + 1) {
    for (local_90a4 = 0; local_90a4 < (int)res_5_1[1]; local_90a4 = local_90a4 + 8) {
      pauVar1 = (undefined1 (*) [16])(lVar2 + (local_90a0 * in_RSI + (long)local_90a4) * 2);
      pauVar3 = (undefined1 (*) [16])(lVar2 + 0x10 + (local_90a0 * in_RSI + (long)local_90a4) * 2);
      auVar33._8_8_ = uVar13;
      auVar33._0_8_ = local_9118;
      auVar43 = pmaddwd(*pauVar1,auVar33);
      auVar4._16_16_ = *pauVar3;
      auVar4._0_16_ = *pauVar1;
      auVar32._12_4_ = uStack_8a4;
      auVar32._8_4_ = uStack_730;
      auVar32._0_8_ = local_9128;
      auVar44 = pmaddwd(auVar4._4_16_,auVar32);
      auVar31._8_8_ = *(undefined8 *)(*pauVar1 + 8);
      auVar31._0_8_ = local_568;
      auVar30._8_8_ = uVar10;
      auVar30._0_8_ = local_9138;
      auVar45 = pmaddwd(auVar31,auVar30);
      auVar5._16_16_ = *pauVar3;
      auVar5._0_16_ = *pauVar1;
      auVar29._12_4_ = uStack_83c;
      auVar29._8_4_ = uStack_750;
      auVar29._0_8_ = local_9148;
      auVar46 = pmaddwd(auVar5._12_16_,auVar29);
      local_328 = auVar43._0_4_;
      iStack_324 = auVar43._4_4_;
      iStack_320 = auVar43._8_4_;
      iStack_31c = auVar43._12_4_;
      local_338 = auVar45._0_4_;
      iStack_334 = auVar45._4_4_;
      iStack_330 = auVar45._8_4_;
      iStack_32c = auVar45._12_4_;
      local_348 = auVar44._0_4_;
      iStack_344 = auVar44._4_4_;
      iStack_340 = auVar44._8_4_;
      iStack_33c = auVar44._12_4_;
      local_358 = auVar46._0_4_;
      iStack_354 = auVar46._4_4_;
      iStack_350 = auVar46._8_4_;
      iStack_34c = auVar46._12_4_;
      iStack_38c = (int)(CONCAT26(res_16bit[0]._6_2_,CONCAT24(res_16bit[0]._4_2_,iVar39)) >> 0x20);
      auVar48 = ZEXT416(*(uint *)res_3_1[1]);
      auVar6._16_16_ = *pauVar3;
      auVar6._0_16_ = *pauVar1;
      auVar28._8_8_ = uVar13;
      auVar28._0_8_ = local_9118;
      auVar43 = pmaddwd(auVar6._2_16_,auVar28);
      auVar7._16_16_ = *pauVar3;
      auVar7._0_16_ = *pauVar1;
      auVar27._12_4_ = uStack_8a4;
      auVar27._8_4_ = uStack_730;
      auVar27._0_8_ = local_9128;
      auVar44 = pmaddwd(auVar7._6_16_,auVar27);
      auVar8._16_16_ = *pauVar3;
      auVar8._0_16_ = *pauVar1;
      auVar26._8_8_ = uVar10;
      auVar26._0_8_ = local_9138;
      auVar45 = pmaddwd(auVar8._10_16_,auVar26);
      auVar9._16_16_ = *pauVar3;
      auVar9._0_16_ = *pauVar1;
      auVar25._12_4_ = uStack_83c;
      auVar25._8_4_ = uStack_750;
      auVar25._0_8_ = local_9148;
      auVar46 = pmaddwd(auVar9._14_16_,auVar25);
      local_3a8 = auVar43._0_4_;
      iStack_3a4 = auVar43._4_4_;
      iStack_3a0 = auVar43._8_4_;
      iStack_39c = auVar43._12_4_;
      local_3b8 = auVar45._0_4_;
      iStack_3b4 = auVar45._4_4_;
      iStack_3b0 = auVar45._8_4_;
      iStack_3ac = auVar45._12_4_;
      local_3c8 = auVar44._0_4_;
      iStack_3c4 = auVar44._4_4_;
      iStack_3c0 = auVar44._8_4_;
      iStack_3bc = auVar44._12_4_;
      local_3d8 = auVar46._0_4_;
      iStack_3d4 = auVar46._4_4_;
      iStack_3d0 = auVar46._8_4_;
      iStack_3cc = auVar46._12_4_;
      auVar43 = ZEXT416(*(uint *)res_3_1[1]);
      sVar38 = (short)(1 << (((byte)res_1_1[0] - (char)*(undefined4 *)res_3_1[1]) + 8 & 0x1f)) + -1;
      auVar37._4_4_ = iStack_324 + iStack_334 + iStack_344 + iStack_354 + iVar39 >> auVar48;
      auVar37._0_4_ = local_328 + local_338 + local_348 + local_358 + iVar39 >> auVar48;
      auVar37._12_4_ = iStack_31c + iStack_32c + iStack_33c + iStack_34c + iStack_38c >> auVar48;
      auVar37._8_4_ = iStack_320 + iStack_330 + iStack_340 + iStack_350 + iVar39 >> auVar48;
      auVar36._4_4_ = iStack_3a4 + iStack_3b4 + iStack_3c4 + iStack_3d4 + iVar39 >> auVar43;
      auVar36._0_4_ = local_3a8 + local_3b8 + local_3c8 + local_3d8 + iVar39 >> auVar43;
      auVar36._12_4_ = iStack_39c + iStack_3ac + iStack_3bc + iStack_3cc + iStack_38c >> auVar43;
      auVar36._8_4_ = iStack_3a0 + iStack_3b0 + iStack_3c0 + iStack_3d0 + iVar39 >> auVar43;
      auVar43 = packssdw(auVar37,auVar36);
      local_1d8 = auVar43._0_2_;
      sStack_1d6 = auVar43._2_2_;
      sStack_1d4 = auVar43._4_2_;
      sStack_1d2 = auVar43._6_2_;
      sStack_1d0 = auVar43._8_2_;
      sStack_1ce = auVar43._10_2_;
      sStack_1cc = auVar43._12_2_;
      sStack_1ca = auVar43._14_2_;
      local_1d8 = (ushort)(-1 < local_1d8) * local_1d8;
      sStack_1d6 = (ushort)(-1 < sStack_1d6) * sStack_1d6;
      sStack_1d4 = (ushort)(-1 < sStack_1d4) * sStack_1d4;
      sStack_1d2 = (ushort)(-1 < sStack_1d2) * sStack_1d2;
      sStack_1d0 = (ushort)(-1 < sStack_1d0) * sStack_1d0;
      sStack_1ce = (ushort)(-1 < sStack_1ce) * sStack_1ce;
      sStack_1cc = (ushort)(-1 < sStack_1cc) * sStack_1cc;
      sStack_1ca = (ushort)(-1 < sStack_1ca) * sStack_1ca;
      local_9238._0_4_ =
           CONCAT22((ushort)(sVar38 < sStack_1d6) * sVar38 |
                    (ushort)(sVar38 >= sStack_1d6) * sStack_1d6,
                    (ushort)(sVar38 < local_1d8) * sVar38 |
                    (ushort)(sVar38 >= local_1d8) * local_1d8);
      local_9238._0_6_ =
           CONCAT24((ushort)(sVar38 < sStack_1d4) * sVar38 |
                    (ushort)(sVar38 >= sStack_1d4) * sStack_1d4,(undefined4)local_9238);
      local_9238 = CONCAT26((ushort)(sVar38 < sStack_1d2) * sVar38 |
                            (ushort)(sVar38 >= sStack_1d2) * sStack_1d2,(undefined6)local_9238);
      uStack_9230._0_2_ =
           (ushort)(sVar38 < sStack_1d0) * sVar38 | (ushort)(sVar38 >= sStack_1d0) * sStack_1d0;
      uStack_9230._2_2_ =
           (ushort)(sVar38 < sStack_1ce) * sVar38 | (ushort)(sVar38 >= sStack_1ce) * sStack_1ce;
      uStack_9230._4_2_ =
           (ushort)(sVar38 < sStack_1cc) * sVar38 | (ushort)(sVar38 >= sStack_1cc) * sStack_1cc;
      uStack_9230._6_2_ =
           (ushort)(sVar38 < sStack_1ca) * sVar38 | (ushort)(sVar38 >= sStack_1ca) * sStack_1ca;
      lVar41 = (long)(local_90a0 * 0x80 + local_90a4) * 2;
      *(undefined8 *)((long)local_9098 + lVar41) = local_9238;
      *(undefined8 *)((long)local_9098 + lVar41 + 8) = uStack_9230;
    }
  }
  uVar10 = *(undefined8 *)res_7_1[1];
  sStack_932 = (short)((ulong)uVar10 >> 0x30);
  uStack_8c4 = (undefined4)(CONCAT26(sStack_932 + 0x80,(int6)uVar10) >> 0x20);
  uVar14 = (undefined4)*(undefined8 *)(res_7_1[1] + 8);
  uStack_85c = (undefined4)((ulong)*(undefined8 *)(res_7_1[1] + 8) >> 0x20);
  uVar13 = CONCAT44((int)uVar10,(int)uVar10);
  local_9278 = CONCAT44(uStack_8c4,uStack_780);
  uVar10 = CONCAT44(uVar14,uVar14);
  local_9298 = CONCAT44(uStack_85c,uStack_7a0);
  cVar42 = (char)*(undefined4 *)(res_3_1[1] + 4);
  iVar39 = (1 << (cVar42 - 1U & 0x1f)) - (1 << (((byte)res_1_1[0] + cVar42) - 1 & 0x1f));
  res_hi_round[0]._4_2_ = (undefined2)iVar39;
  res_hi_round[0]._6_2_ = (undefined2)((uint)iVar39 >> 0x10);
  for (local_90a0 = 0; local_90a0 < (int)res_3_1[0]; local_90a0 = local_90a0 + 1) {
    for (local_90a4 = 0; local_90a4 < (int)res_5_1[1]; local_90a4 = local_90a4 + 8) {
      lVar2 = (long)(local_90a0 * 0x80 + local_90a4) * 2;
      uVar11 = *(undefined8 *)((long)local_9098 + lVar2);
      uVar12 = *(undefined8 *)((long)auStack_8f98 + lVar2);
      local_118 = (undefined2)uVar11;
      uStack_116 = (undefined2)((ulong)uVar11 >> 0x10);
      uStack_114 = (undefined2)((ulong)uVar11 >> 0x20);
      uStack_112 = (undefined2)((ulong)uVar11 >> 0x30);
      local_128 = (undefined2)uVar12;
      uStack_126 = (undefined2)((ulong)uVar12 >> 0x10);
      uStack_124 = (undefined2)((ulong)uVar12 >> 0x20);
      uStack_122 = (undefined2)((ulong)uVar12 >> 0x30);
      uVar11 = *(undefined8 *)((long)auStack_8e98 + lVar2);
      uVar12 = *(undefined8 *)((long)auStack_8d98 + lVar2);
      local_138 = (undefined2)uVar11;
      uStack_136 = (undefined2)((ulong)uVar11 >> 0x10);
      uStack_134 = (undefined2)((ulong)uVar11 >> 0x20);
      uStack_132 = (undefined2)((ulong)uVar11 >> 0x30);
      local_148 = (undefined2)uVar12;
      uStack_146 = (undefined2)((ulong)uVar12 >> 0x10);
      uStack_144 = (undefined2)((ulong)uVar12 >> 0x20);
      uStack_142 = (undefined2)((ulong)uVar12 >> 0x30);
      uVar11 = *(undefined8 *)((long)auStack_8c98 + lVar2);
      uVar12 = *(undefined8 *)((long)auStack_8b98 + lVar2);
      local_158 = (undefined2)uVar11;
      uStack_156 = (undefined2)((ulong)uVar11 >> 0x10);
      uStack_154 = (undefined2)((ulong)uVar11 >> 0x20);
      uStack_152 = (undefined2)((ulong)uVar11 >> 0x30);
      local_168 = (undefined2)uVar12;
      uStack_166 = (undefined2)((ulong)uVar12 >> 0x10);
      uStack_164 = (undefined2)((ulong)uVar12 >> 0x20);
      uStack_162 = (undefined2)((ulong)uVar12 >> 0x30);
      uVar11 = *(undefined8 *)((long)auStack_8a98 + lVar2);
      uVar12 = *(undefined8 *)((long)auStack_8998 + lVar2);
      local_178 = (undefined2)uVar11;
      uStack_176 = (undefined2)((ulong)uVar11 >> 0x10);
      uStack_174 = (undefined2)((ulong)uVar11 >> 0x20);
      uStack_172 = (undefined2)((ulong)uVar11 >> 0x30);
      local_188 = (undefined2)uVar12;
      uStack_186 = (undefined2)((ulong)uVar12 >> 0x10);
      uStack_184 = (undefined2)((ulong)uVar12 >> 0x20);
      uStack_182 = (undefined2)((ulong)uVar12 >> 0x30);
      auVar24._2_2_ = local_128;
      auVar24._0_2_ = local_118;
      auVar24._4_2_ = uStack_116;
      auVar24._6_2_ = uStack_126;
      auVar24._10_2_ = uStack_124;
      auVar24._8_2_ = uStack_114;
      auVar24._12_2_ = uStack_112;
      auVar24._14_2_ = uStack_122;
      auVar23._8_8_ = uVar13;
      auVar23._0_8_ = local_9278;
      auVar43 = pmaddwd(auVar24,auVar23);
      auVar22._2_2_ = local_148;
      auVar22._0_2_ = local_138;
      auVar22._4_2_ = uStack_136;
      auVar22._6_2_ = uStack_146;
      auVar22._10_2_ = uStack_144;
      auVar22._8_2_ = uStack_134;
      auVar22._12_2_ = uStack_132;
      auVar22._14_2_ = uStack_142;
      auVar21._12_4_ = uStack_8c4;
      auVar21._8_4_ = uStack_770;
      auVar21._0_8_ = local_9288;
      auVar44 = pmaddwd(auVar22,auVar21);
      auVar20._2_2_ = local_168;
      auVar20._0_2_ = local_158;
      auVar20._4_2_ = uStack_156;
      auVar20._6_2_ = uStack_166;
      auVar20._10_2_ = uStack_164;
      auVar20._8_2_ = uStack_154;
      auVar20._12_2_ = uStack_152;
      auVar20._14_2_ = uStack_162;
      auVar19._8_8_ = uVar10;
      auVar19._0_8_ = local_9298;
      auVar45 = pmaddwd(auVar20,auVar19);
      auVar18._2_2_ = local_188;
      auVar18._0_2_ = local_178;
      auVar18._4_2_ = uStack_176;
      auVar18._6_2_ = uStack_186;
      auVar18._10_2_ = uStack_184;
      auVar18._8_2_ = uStack_174;
      auVar18._12_2_ = uStack_172;
      auVar18._14_2_ = uStack_182;
      auVar17._12_4_ = uStack_85c;
      auVar17._8_4_ = uStack_790;
      auVar17._0_8_ = local_92a8;
      auVar46 = pmaddwd(auVar18,auVar17);
      local_428 = auVar43._0_4_;
      iStack_424 = auVar43._4_4_;
      iStack_420 = auVar43._8_4_;
      iStack_41c = auVar43._12_4_;
      local_438 = auVar44._0_4_;
      iStack_434 = auVar44._4_4_;
      iStack_430 = auVar44._8_4_;
      iStack_42c = auVar44._12_4_;
      local_448 = auVar45._0_4_;
      iStack_444 = auVar45._4_4_;
      iStack_440 = auVar45._8_4_;
      iStack_43c = auVar45._12_4_;
      local_458 = auVar46._0_4_;
      iStack_454 = auVar46._4_4_;
      iStack_450 = auVar46._8_4_;
      iStack_44c = auVar46._12_4_;
      uVar11 = *(undefined8 *)((long)local_9098 + lVar2 + 8);
      uVar12 = *(undefined8 *)((long)auStack_8f98 + lVar2 + 8);
      uStack_90 = (undefined2)uVar11;
      uStack_8e = (undefined2)((ulong)uVar11 >> 0x10);
      uStack_8c = (undefined2)((ulong)uVar11 >> 0x20);
      uStack_8a = (undefined2)((ulong)uVar11 >> 0x30);
      uStack_a0 = (undefined2)uVar12;
      uStack_9e = (undefined2)((ulong)uVar12 >> 0x10);
      uStack_9c = (undefined2)((ulong)uVar12 >> 0x20);
      uStack_9a = (undefined2)((ulong)uVar12 >> 0x30);
      uVar11 = *(undefined8 *)((long)auStack_8e98 + lVar2 + 8);
      uVar12 = *(undefined8 *)((long)auStack_8d98 + lVar2 + 8);
      uStack_b0 = (undefined2)uVar11;
      uStack_ae = (undefined2)((ulong)uVar11 >> 0x10);
      uStack_ac = (undefined2)((ulong)uVar11 >> 0x20);
      uStack_aa = (undefined2)((ulong)uVar11 >> 0x30);
      uStack_c0 = (undefined2)uVar12;
      uStack_be = (undefined2)((ulong)uVar12 >> 0x10);
      uStack_bc = (undefined2)((ulong)uVar12 >> 0x20);
      uStack_ba = (undefined2)((ulong)uVar12 >> 0x30);
      uVar11 = *(undefined8 *)((long)auStack_8c98 + lVar2 + 8);
      uVar12 = *(undefined8 *)((long)auStack_8b98 + lVar2 + 8);
      uStack_d0 = (undefined2)uVar11;
      uStack_ce = (undefined2)((ulong)uVar11 >> 0x10);
      uStack_cc = (undefined2)((ulong)uVar11 >> 0x20);
      uStack_ca = (undefined2)((ulong)uVar11 >> 0x30);
      uStack_e0 = (undefined2)uVar12;
      uStack_de = (undefined2)((ulong)uVar12 >> 0x10);
      uStack_dc = (undefined2)((ulong)uVar12 >> 0x20);
      uStack_da = (undefined2)((ulong)uVar12 >> 0x30);
      uVar11 = *(undefined8 *)((long)auStack_8a98 + lVar2 + 8);
      uVar12 = *(undefined8 *)((long)auStack_8998 + lVar2 + 8);
      uStack_f0 = (undefined2)uVar11;
      uStack_ee = (undefined2)((ulong)uVar11 >> 0x10);
      uStack_ec = (undefined2)((ulong)uVar11 >> 0x20);
      uStack_ea = (undefined2)((ulong)uVar11 >> 0x30);
      uStack_100 = (undefined2)uVar12;
      uStack_fe = (undefined2)((ulong)uVar12 >> 0x10);
      uStack_fc = (undefined2)((ulong)uVar12 >> 0x20);
      uStack_fa = (undefined2)((ulong)uVar12 >> 0x30);
      auVar16._2_2_ = uStack_a0;
      auVar16._0_2_ = uStack_90;
      auVar16._4_2_ = uStack_8e;
      auVar16._6_2_ = uStack_9e;
      auVar16._10_2_ = uStack_9c;
      auVar16._8_2_ = uStack_8c;
      auVar16._12_2_ = uStack_8a;
      auVar16._14_2_ = uStack_9a;
      auVar47._8_8_ = uVar13;
      auVar47._0_8_ = local_9278;
      auVar47 = pmaddwd(auVar16,auVar47);
      auVar15._2_2_ = uStack_c0;
      auVar15._0_2_ = uStack_b0;
      auVar15._4_2_ = uStack_ae;
      auVar15._6_2_ = uStack_be;
      auVar15._10_2_ = uStack_bc;
      auVar15._8_2_ = uStack_ac;
      auVar15._12_2_ = uStack_aa;
      auVar15._14_2_ = uStack_ba;
      auVar48._12_4_ = uStack_8c4;
      auVar48._8_4_ = uStack_770;
      auVar48._0_8_ = local_9288;
      auVar48 = pmaddwd(auVar15,auVar48);
      auVar46._2_2_ = uStack_e0;
      auVar46._0_2_ = uStack_d0;
      auVar46._4_2_ = uStack_ce;
      auVar46._6_2_ = uStack_de;
      auVar46._10_2_ = uStack_dc;
      auVar46._8_2_ = uStack_cc;
      auVar46._12_2_ = uStack_ca;
      auVar46._14_2_ = uStack_da;
      auVar45._8_8_ = uVar10;
      auVar45._0_8_ = local_9298;
      auVar45 = pmaddwd(auVar46,auVar45);
      auVar44._2_2_ = uStack_100;
      auVar44._0_2_ = uStack_f0;
      auVar44._4_2_ = uStack_ee;
      auVar44._6_2_ = uStack_fe;
      auVar44._10_2_ = uStack_fc;
      auVar44._8_2_ = uStack_ec;
      auVar44._12_2_ = uStack_ea;
      auVar44._14_2_ = uStack_fa;
      auVar43._12_4_ = uStack_85c;
      auVar43._8_4_ = uStack_790;
      auVar43._0_8_ = local_92a8;
      auVar43 = pmaddwd(auVar44,auVar43);
      local_488 = auVar47._0_4_;
      iStack_484 = auVar47._4_4_;
      iStack_480 = auVar47._8_4_;
      iStack_47c = auVar47._12_4_;
      local_498 = auVar48._0_4_;
      iStack_494 = auVar48._4_4_;
      iStack_490 = auVar48._8_4_;
      iStack_48c = auVar48._12_4_;
      local_4a8 = auVar45._0_4_;
      iStack_4a4 = auVar45._4_4_;
      iStack_4a0 = auVar45._8_4_;
      iStack_49c = auVar45._12_4_;
      local_4b8 = auVar43._0_4_;
      iStack_4b4 = auVar43._4_4_;
      iStack_4b0 = auVar43._8_4_;
      iStack_4ac = auVar43._12_4_;
      iStack_4ec = (int)(CONCAT26(res_hi_round[0]._6_2_,CONCAT24(res_hi_round[0]._4_2_,iVar39)) >>
                        0x20);
      auVar43 = ZEXT416(*(uint *)(res_3_1[1] + 4));
      auVar44 = ZEXT416(*(uint *)(res_3_1[1] + 4));
      sVar38 = (short)(1 << ((byte)res_1_1[0] & 0x1f)) + -1;
      auVar35._4_4_ = local_488 + local_498 + local_4a8 + local_4b8 + iVar39 >> auVar43;
      auVar35._0_4_ = local_428 + local_438 + local_448 + local_458 + iVar39 >> auVar43;
      auVar35._12_4_ = iStack_484 + iStack_494 + iStack_4a4 + iStack_4b4 + iStack_4ec >> auVar43;
      auVar35._8_4_ = iStack_424 + iStack_434 + iStack_444 + iStack_454 + iVar39 >> auVar43;
      auVar34._4_4_ = iStack_480 + iStack_490 + iStack_4a0 + iStack_4b0 + iVar39 >> auVar44;
      auVar34._0_4_ = iStack_420 + iStack_430 + iStack_440 + iStack_450 + iVar39 >> auVar44;
      auVar34._12_4_ = iStack_47c + iStack_48c + iStack_49c + iStack_4ac + iStack_4ec >> auVar44;
      auVar34._8_4_ = iStack_41c + iStack_42c + iStack_43c + iStack_44c + iVar39 >> auVar44;
      auVar43 = packssdw(auVar35,auVar34);
      local_1f8 = auVar43._0_2_;
      sStack_1f6 = auVar43._2_2_;
      sStack_1f4 = auVar43._4_2_;
      sStack_1f2 = auVar43._6_2_;
      sStack_1f0 = auVar43._8_2_;
      sStack_1ee = auVar43._10_2_;
      sStack_1ec = auVar43._12_2_;
      sStack_1ea = auVar43._14_2_;
      local_1f8 = (ushort)(-1 < local_1f8) * local_1f8;
      sStack_1f6 = (ushort)(-1 < sStack_1f6) * sStack_1f6;
      sStack_1f4 = (ushort)(-1 < sStack_1f4) * sStack_1f4;
      sStack_1f2 = (ushort)(-1 < sStack_1f2) * sStack_1f2;
      sStack_1f0 = (ushort)(-1 < sStack_1f0) * sStack_1f0;
      sStack_1ee = (ushort)(-1 < sStack_1ee) * sStack_1ee;
      sStack_1ec = (ushort)(-1 < sStack_1ec) * sStack_1ec;
      sStack_1ea = (ushort)(-1 < sStack_1ea) * sStack_1ea;
      local_9448._0_4_ =
           CONCAT22((ushort)(sVar38 < sStack_1f6) * sVar38 |
                    (ushort)(sVar38 >= sStack_1f6) * sStack_1f6,
                    (ushort)(sVar38 < local_1f8) * sVar38 |
                    (ushort)(sVar38 >= local_1f8) * local_1f8);
      local_9448._0_6_ =
           CONCAT24((ushort)(sVar38 < sStack_1f4) * sVar38 |
                    (ushort)(sVar38 >= sStack_1f4) * sStack_1f4,(undefined4)local_9448);
      local_9448 = CONCAT26((ushort)(sVar38 < sStack_1f2) * sVar38 |
                            (ushort)(sVar38 >= sStack_1f2) * sStack_1f2,(undefined6)local_9448);
      uStack_9440._0_2_ =
           (ushort)(sVar38 < sStack_1f0) * sVar38 | (ushort)(sVar38 >= sStack_1f0) * sStack_1f0;
      uStack_9440._2_2_ =
           (ushort)(sVar38 < sStack_1ee) * sVar38 | (ushort)(sVar38 >= sStack_1ee) * sStack_1ee;
      uStack_9440._4_2_ =
           (ushort)(sVar38 < sStack_1ec) * sVar38 | (ushort)(sVar38 >= sStack_1ec) * sStack_1ec;
      uStack_9440._6_2_ =
           (ushort)(sVar38 < sStack_1ea) * sVar38 | (ushort)(sVar38 >= sStack_1ea) * sStack_1ea;
      puVar40 = (undefined8 *)(in_RDX * 2 + (local_90a0 * in_RCX + (long)local_90a4) * 2);
      *puVar40 = local_9448;
      puVar40[1] = uStack_9440;
    }
  }
  return;
}

Assistant:

void av1_highbd_wiener_convolve_add_src_ssse3(
    const uint8_t *src8, ptrdiff_t src_stride, uint8_t *dst8,
    ptrdiff_t dst_stride, const int16_t *filter_x, int x_step_q4,
    const int16_t *filter_y, int y_step_q4, int w, int h,
    const WienerConvolveParams *conv_params, int bd) {
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  assert(bd + FILTER_BITS - conv_params->round_0 + 2 <= 16);
  (void)x_step_q4;
  (void)y_step_q4;

  const uint16_t *const src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *const dst = CONVERT_TO_SHORTPTR(dst8);

  DECLARE_ALIGNED(16, uint16_t,
                  temp[(MAX_SB_SIZE + SUBPEL_TAPS - 1) * MAX_SB_SIZE]);
  int intermediate_height = h + SUBPEL_TAPS - 1;
  int i, j;
  const int center_tap = ((SUBPEL_TAPS - 1) / 2);
  const uint16_t *const src_ptr = src - center_tap * src_stride - center_tap;

  const __m128i zero = _mm_setzero_si128();
  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i offset = _mm_insert_epi16(zero, 1 << FILTER_BITS, 3);

  /* Horizontal filter */
  {
    const __m128i coeffs_x =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_x), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        (1 << (conv_params->round_0 - 1)) + (1 << (bd + FILTER_BITS - 1)));

    for (i = 0; i < intermediate_height; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        const __m128i data2 =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j + 8]);

        // Filter even-index pixels
        const __m128i res_0 = _mm_madd_epi16(data, coeff_01);
        const __m128i res_2 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 4), coeff_23);
        const __m128i res_4 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 8), coeff_45);
        const __m128i res_6 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 12), coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even = _mm_srai_epi32(_mm_add_epi32(res_even, round_const),
                                  conv_params->round_0);

        // Filter odd-index pixels
        const __m128i res_1 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 2), coeff_01);
        const __m128i res_3 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 6), coeff_23);
        const __m128i res_5 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 10), coeff_45);
        const __m128i res_7 =
            _mm_madd_epi16(_mm_alignr_epi8(data2, data, 14), coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd = _mm_srai_epi32(_mm_add_epi32(res_odd, round_const),
                                 conv_params->round_0);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        const __m128i maxval =
            _mm_set1_epi16((WIENER_CLAMP_LIMIT(conv_params->round_0, bd)) - 1);
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        res = _mm_min_epi16(_mm_max_epi16(res, zero), maxval);
        _mm_storeu_si128((__m128i *)&temp[i * MAX_SB_SIZE + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const __m128i coeffs_y =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_y), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const =
        _mm_set1_epi32((1 << (conv_params->round_1 - 1)) -
                       (1 << (bd + conv_params->round_1 - 1)));

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const uint16_t *data = &temp[i * MAX_SB_SIZE + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round = _mm_srai_epi32(
            _mm_add_epi32(res_lo, round_const), conv_params->round_1);
        const __m128i res_hi_round = _mm_srai_epi32(
            _mm_add_epi32(res_hi, round_const), conv_params->round_1);

        const __m128i maxval = _mm_set1_epi16((1 << bd) - 1);
        __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
        res_16bit = _mm_min_epi16(_mm_max_epi16(res_16bit, zero), maxval);

        __m128i *const p = (__m128i *)&dst[i * dst_stride + j];
        _mm_storeu_si128(p, res_16bit);
      }
    }
  }
}